

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::generate_codebook
          (tree_clusterizer<crnlib::vec<6U,_float>_> *this,vec<6U,_float> *vectors,uint *weights,
          uint size,uint max_splits,bool generate_node_index_map,task_pool *pTask_pool)

{
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::VectorInfo> *this_00;
  vector<crnlib::vec<6U,_float>_> *this_01;
  ulong uVar1;
  uint *puVar2;
  float fVar3;
  vec<6U,_float> *pvVar4;
  raw_node *prVar5;
  byte bVar6;
  double dVar7;
  uint new_hash_size;
  undefined8 uVar8;
  hash_map_type *phVar9;
  bool bVar10;
  uint i_2;
  uint uVar11;
  uint32 uVar12;
  vq_node *pvVar13;
  long lVar14;
  executable_task *pObj;
  value_type *pvVar15;
  node_vec_type *pnVar16;
  vq_node *pvVar17;
  vec<6U,_float> *pvVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined4 in_register_00000084;
  undefined7 in_register_00000089;
  long lVar25;
  int iVar26;
  uint uVar27;
  bool bVar28;
  float fVar29;
  float fVar30;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  alternative_node_queue;
  vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::split_alternative_node_task_params>
  params;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  node_queue;
  vq_node root;
  uint local_104;
  uint local_fc;
  node_vec_type *local_f8;
  ulong local_f0;
  undefined1 local_e8 [8];
  value_type vStack_e0;
  value_type local_d8;
  float local_d0 [4];
  elemental_vector *local_c0;
  insert_result local_b8;
  undefined4 local_9c;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  ulong uStack_60;
  float local_58;
  undefined4 local_54;
  uint local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined2 local_40;
  undefined1 local_3e;
  
  local_f0 = CONCAT44(in_register_00000084,max_splits);
  local_9c = (undefined4)CONCAT71(in_register_00000089,generate_node_index_map);
  this->m_vectors = vectors;
  this_00 = &this->m_vectorsInfo;
  uVar27 = (this->m_vectorsInfo).m_size;
  if (uVar27 != size) {
    if ((uVar27 <= size) && ((this->m_vectorsInfo).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)this_00,size,uVar27 + 1 == size,8,(object_mover)0x0,false);
    }
    (this->m_vectorsInfo).m_size = size;
  }
  this_01 = &this->m_weightedVectors;
  uVar27 = (this->m_weightedVectors).m_size;
  if (uVar27 != size) {
    if ((uVar27 <= size) && ((this->m_weightedVectors).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)this_01,size,uVar27 + 1 == size,0x18,(object_mover)0x0,false);
    }
    (this->m_weightedVectors).m_size = size;
  }
  pnVar16 = (node_vec_type *)&this->m_weightedDotProducts;
  uVar27 = (this->m_weightedDotProducts).m_size;
  if (uVar27 != size) {
    if (uVar27 <= size) {
      if ((this->m_weightedDotProducts).m_capacity < size) {
        local_f8 = pnVar16;
        elemental_vector::increase_capacity
                  ((elemental_vector *)pnVar16,size,uVar27 + 1 == size,8,(object_mover)0x0,false);
        uVar27 = (this->m_weightedDotProducts).m_size;
        pnVar16 = local_f8;
      }
      memset(((vector<double> *)pnVar16)->m_p + uVar27,0,(ulong)(size - uVar27) << 3);
    }
    (this->m_weightedDotProducts).m_size = size;
  }
  uVar27 = (this->m_vectorsInfoLeft).m_size;
  if (uVar27 != size) {
    if ((uVar27 <= size) && ((this->m_vectorsInfoLeft).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfoLeft,size,uVar27 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_vectorsInfoLeft).m_size = size;
  }
  uVar27 = (this->m_vectorsInfoRight).m_size;
  if (uVar27 != size) {
    if ((uVar27 <= size) && ((this->m_vectorsInfoRight).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfoRight,size,uVar27 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_vectorsInfoRight).m_size = size;
  }
  pnVar16 = (node_vec_type *)&this->m_vectorComparison;
  uVar27 = (this->m_vectorComparison).m_size;
  if (uVar27 != size) {
    if (uVar27 <= size) {
      if ((this->m_vectorComparison).m_capacity < size) {
        local_f8 = pnVar16;
        elemental_vector::increase_capacity
                  ((elemental_vector *)pnVar16,size,uVar27 + 1 == size,1,(object_mover)0x0,false);
        uVar27 = (this->m_vectorComparison).m_size;
        pnVar16 = local_f8;
      }
      memset((void *)((ulong)uVar27 + (long)((vector<double> *)pnVar16)->m_p),0,
             (ulong)(size - uVar27));
    }
    (this->m_vectorComparison).m_size = size;
  }
  local_f8 = &this->m_nodes;
  uVar22 = (int)local_f0 * 4;
  uVar27 = (this->m_nodes).m_size;
  if (uVar27 != uVar22) {
    if (uVar27 <= uVar22) {
      if ((this->m_nodes).m_capacity < uVar22) {
        local_c0 = (elemental_vector *)CONCAT44(local_c0._4_4_,uVar22);
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_f8,uVar22,uVar27 + 1 == uVar22,0x40,
                   vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::vq_node>::object_mover,
                   false);
        uVar27 = (this->m_nodes).m_size;
        uVar22 = (uint)local_c0;
      }
      if (uVar22 - uVar27 != 0) {
        pvVar17 = local_f8->m_p + uVar27;
        pvVar13 = pvVar17 + (uVar22 - uVar27);
        do {
          (pvVar17->m_centroid).m_s[4] = 0.0;
          (pvVar17->m_centroid).m_s[5] = 0.0;
          pvVar17->m_total_weight = 0;
          (pvVar17->m_centroid).m_s[0] = 0.0;
          (pvVar17->m_centroid).m_s[1] = 0.0;
          (pvVar17->m_centroid).m_s[2] = 0.0;
          (pvVar17->m_centroid).m_s[3] = 0.0;
          pvVar17->m_left = -1;
          pvVar17->m_right = -1;
          pvVar17->m_codebook_index = -1;
          pvVar17->m_unsplittable = false;
          pvVar17->m_alternative = false;
          pvVar17->m_processed = false;
          pvVar17 = pvVar17 + 1;
        } while (pvVar17 != pvVar13);
      }
    }
    (this->m_nodes).m_size = uVar22;
  }
  pvVar18 = (this->m_codebook).m_p;
  if (pvVar18 != (vec<6U,_float> *)0x0) {
    crnlib_free(pvVar18);
    (this->m_codebook).m_p = (vec<6U,_float> *)0x0;
    (this->m_codebook).m_size = 0;
    (this->m_codebook).m_capacity = 0;
  }
  uVar21 = local_f0;
  if (pTask_pool == (task_pool *)0x0) {
    local_104 = 1;
  }
  else {
    local_104 = pTask_pool->m_num_threads + 1;
  }
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  uStack_4c = 0xffffffff;
  uStack_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  local_40 = 0;
  local_3e = 0;
  local_54 = 0;
  if ((this->m_vectorsInfo).m_size == 0) {
    dVar7 = 0.0;
    fVar29 = 0.0;
    local_78._0_4_ = 0.0;
  }
  else {
    dVar7 = 0.0;
    lVar14 = 0;
    uVar23 = 0;
    pvVar18 = vectors;
    do {
      this_00->m_p[uVar23].index = (uint)uVar23;
      uVar27 = weights[uVar23];
      this_00->m_p[uVar23].weight = uVar27;
      fVar29 = (float)uVar27;
      lVar25 = 0;
      do {
        *(float *)((long)&local_98.c.
                          super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar25 * 4) =
             pvVar18->m_s[lVar25] * fVar29;
        lVar25 = lVar25 + 1;
      } while (lVar25 != 6);
      pvVar4 = this_01->m_p;
      *(pointer *)(pvVar4[uVar23].m_s + 4) =
           local_98.c.
           super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar4 = pvVar4 + uVar23;
      *(pointer *)pvVar4->m_s =
           local_98.c.
           super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)(pvVar4->m_s + 2) =
           local_98.c.
           super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pvVar4 = this_01->m_p;
      lVar25 = 0;
      do {
        *(float *)((long)&local_78 + lVar25 * 4) =
             *(float *)((long)pvVar4->m_s + lVar25 * 4 + lVar14) +
             *(float *)((long)&local_78 + lVar25 * 4);
        lVar25 = lVar25 + 1;
      } while (lVar25 != 6);
      uStack_60 = uVar27 + uStack_60;
      fVar30 = vectors[uVar23].m_s[0] * vectors[uVar23].m_s[0];
      lVar25 = 1;
      do {
        fVar30 = fVar30 + pvVar18->m_s[lVar25] * pvVar18->m_s[lVar25];
        lVar25 = lVar25 + 1;
      } while (lVar25 != 6);
      (this->m_weightedDotProducts).m_p[uVar23] = (double)(fVar30 * fVar29);
      dVar7 = dVar7 + (this->m_weightedDotProducts).m_p[uVar23];
      uVar23 = uVar23 + 1;
      pvVar18 = pvVar18 + 1;
      lVar14 = lVar14 + 0x18;
    } while (uVar23 < (this->m_vectorsInfo).m_size);
    fVar29 = (float)uStack_60;
  }
  uVar27 = (uint)local_f0;
  fVar30 = (float)local_78 * (float)local_78;
  lVar14 = 1;
  do {
    fVar3 = *(float *)((long)&local_78 + lVar14 * 4);
    fVar30 = fVar30 + fVar3 * fVar3;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 6);
  local_58 = (float)(dVar7 - (double)(fVar30 / fVar29));
  lVar14 = 0;
  do {
    *(float *)((long)&local_78 + lVar14 * 4) =
         *(float *)((long)&local_78 + lVar14 * 4) * (1.0 / fVar29);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 6);
  local_98.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_fc = 0;
  pvVar13 = local_f8->m_p;
  *(undefined8 *)((pvVar13->m_centroid).m_s + 4) = local_68;
  *(undefined8 *)(pvVar13->m_centroid).m_s = local_78;
  *(undefined8 *)((pvVar13->m_centroid).m_s + 2) = uStack_70;
  *(undefined4 *)((long)&pvVar13->m_codebook_index + 3) = 0xff;
  pvVar13->m_end = size;
  pvVar13->m_left = 0xffffffff;
  pvVar13->m_right = -1;
  pvVar13->m_codebook_index = -1;
  pvVar13->m_total_weight = uStack_60;
  pvVar13->m_variance = (float)(int)(ulong)(uint)local_58;
  pvVar13->m_begin = (int)((ulong)(uint)local_58 >> 0x20);
  local_e8 = (undefined1  [8])((ulong)(uint)local_58 << 0x20);
  local_c0 = (elemental_vector *)&this->m_codebook;
  local_50 = size;
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  ::push(&local_98,(value_type *)local_e8);
  local_fc = local_fc + 1;
  uVar20 = 1;
  uVar22 = uVar20;
  if (1 < local_104) {
    if (1 < uVar27) {
      do {
        uVar22 = uVar20;
        if (((long)local_98.c.
                   super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_98.c.
                   super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3 == (ulong)local_104) ||
           (bVar10 = split_node(this,&local_98,&local_fc,pTask_pool), !bVar10)) break;
        uVar20 = uVar20 + 1;
        uVar22 = uVar27;
      } while (uVar27 != uVar20);
    }
    if ((long)local_98.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_98.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3 == (ulong)local_104) {
      std::
      vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
      ::vector((vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                *)local_e8,&local_98.c);
      uVar11 = (uint)((uVar21 & 0xffffffff) / (ulong)local_104);
      local_b8.first.m_pTable = (hash_map_type *)0x0;
      local_b8.first.m_index = 0;
      local_b8.first._12_4_ = 0;
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_b8,local_104,false,0xc,(object_mover)0x0,false);
      local_b8.first.m_index = local_104;
      if ((value_type)local_e8 != vStack_e0) {
        iVar26 = (int)local_f0 * 2;
        uVar27 = 0;
        do {
          phVar9 = local_b8.first.m_pTable;
          uVar21 = (ulong)uVar27;
          *(undefined4 *)((long)&((local_b8.first.m_pTable)->m_values).m_p + uVar21 * 0xc) =
               *(undefined4 *)local_e8;
          *(int *)((long)&((local_b8.first.m_pTable)->m_values).m_p + uVar21 * 0xc + 4) = iVar26;
          (&((local_b8.first.m_pTable)->m_values).m_size)[uVar21 * 3] = uVar11;
          pObj = (executable_task *)crnlib_malloc(0x28);
          pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001db990;
          pObj[1]._vptr_executable_task = (_func_int **)this;
          pObj[2]._vptr_executable_task = (_func_int **)split_alternative_node_task;
          pObj[3]._vptr_executable_task = (_func_int **)0x0;
          *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
          task_pool::queue_task
                    (pTask_pool,pObj,uVar21,(void *)((long)&(phVar9->m_values).m_p + uVar21 * 0xc));
          std::
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
          ::pop((priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                 *)local_e8);
          iVar26 = iVar26 + uVar11 * 2;
          uVar27 = uVar27 + 1;
        } while ((value_type)local_e8 != vStack_e0);
      }
      task_pool::join(pTask_pool);
      uVar27 = (uint)local_f0;
      if (local_b8.first.m_pTable != (hash_map_type *)0x0) {
        crnlib_free(local_b8.first.m_pTable);
      }
      if ((value_type)local_e8 != (value_type)0x0) {
        operator_delete((void *)local_e8);
      }
    }
  }
  if (uVar22 < uVar27) {
    iVar26 = ~uVar22 + uVar27;
    do {
      bVar10 = split_node(this,&local_98,&local_fc,pTask_pool);
      bVar28 = iVar26 != 0;
      iVar26 = iVar26 + -1;
    } while (bVar10 && bVar28);
  }
  if (local_fc != 0) {
    uVar21 = 0;
    do {
      pvVar13 = local_f8->m_p;
      if ((pvVar13[uVar21].m_alternative != false) || (pvVar13[uVar21].m_left == -1)) {
        pvVar13 = pvVar13 + uVar21;
        uVar27 = (this->m_codebook).m_size;
        pvVar13->m_codebook_index = uVar27;
        if ((this->m_codebook).m_capacity <= uVar27) {
          elemental_vector::increase_capacity(local_c0,uVar27 + 1,true,0x18,(object_mover)0x0,false)
          ;
          uVar27 = (this->m_codebook).m_size;
        }
        pvVar18 = (this->m_codebook).m_p;
        *(undefined8 *)(pvVar18[uVar27].m_s + 4) = *(undefined8 *)((pvVar13->m_centroid).m_s + 4);
        uVar8 = *(undefined8 *)((pvVar13->m_centroid).m_s + 2);
        pvVar18 = pvVar18 + uVar27;
        *(undefined8 *)pvVar18->m_s = *(undefined8 *)(pvVar13->m_centroid).m_s;
        *(undefined8 *)(pvVar18->m_s + 2) = uVar8;
        puVar2 = &(this->m_codebook).m_size;
        *puVar2 = *puVar2 + 1;
        if (((char)local_9c != '\0') &&
           (uVar23 = (ulong)pvVar13->m_begin, pvVar13->m_begin < pvVar13->m_end)) {
          do {
            uVar27 = (this->m_vectorsInfo).m_p[uVar23].index;
            local_d0[0] = (float)pvVar13->m_codebook_index;
            pvVar15 = (value_type *)(this->m_vectors + uVar27);
            local_e8 = *(undefined1 (*) [8])pvVar15;
            vStack_e0 = pvVar15[1];
            local_d8 = *(value_type *)(this->m_vectors[uVar27].m_s + 4);
            local_b8.first.m_pTable = (hash_map_type *)0x0;
            local_b8.first._8_8_ = local_b8.first._8_8_ & 0xffffffff00000000;
            local_b8.second = false;
            if ((this->m_node_index_map).m_values.m_size == 0) {
              uVar11 = 0;
LAB_00187d23:
              new_hash_size = uVar11 * 2;
              if (uVar11 * 2 < 5) {
                new_hash_size = 4;
              }
              hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
              ::rehash(&this->m_node_index_map,new_hash_size);
              bVar10 = hash_map<crnlib::vec<6U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<6U,_float>_>,_crnlib::equal_to<crnlib::vec<6U,_float>_>_>
                       ::insert_no_grow(&this->m_node_index_map,&local_b8,(vec<6U,_float> *)local_e8
                                        ,(uint *)local_d0);
              if (!bVar10) {
                crnlib_fail("\"insert() failed\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/DaemonEngine[P]crunch/crnlib/crn_hash_map.h"
                            ,0x15d);
              }
            }
            else {
              uVar12 = fast_hash((vec<6U,_float> *)local_e8,0x18);
              bVar6 = (byte)(this->m_node_index_map).m_hash_shift & 0x1f;
              uVar27 = uVar12 * -0x61c88647 >> bVar6;
              uVar19 = (ulong)uVar27;
              prVar5 = (this->m_node_index_map).m_values.m_p;
              pvVar15 = (value_type *)(prVar5 + uVar19);
              if (prVar5[uVar19].m_bits[0x1c] != '\0') {
                if (((float)pvVar15->m_index == (float)local_e8._0_4_) &&
                   (!NAN((float)pvVar15->m_index) && !NAN((float)local_e8._0_4_))) {
                  uVar24 = 0xffffffffffffffff;
                  do {
                    if (uVar24 == 4) goto LAB_00187d69;
                    lVar14 = uVar24 * 4;
                    uVar1 = uVar24 + 1;
                    lVar25 = uVar24 - 4;
                  } while ((*(float *)(prVar5[uVar19].m_bits + lVar14 + 8) == local_d0[lVar25]) &&
                          (uVar24 = uVar1,
                          !NAN(*(float *)(prVar5[uVar19].m_bits + lVar14 + 8)) &&
                          !NAN(local_d0[lVar25])));
                  if (4 < uVar1) goto LAB_00187d69;
                }
                uVar11 = (this->m_node_index_map).m_values.m_size;
                uVar20 = uVar11 - 1;
                uVar22 = uVar27 - 1;
                if (uVar19 == 0) {
                  uVar22 = uVar20;
                }
                if (uVar27 != uVar22) {
                  pvVar15 = pvVar15 + -4;
                  if (uVar12 * -0x61c88647 >> bVar6 == 0) {
                    pvVar15 = (value_type *)(prVar5 + uVar20);
                  }
                  do {
                    if (*(char *)&pvVar15[3].m_variance == '\0') goto LAB_00187cea;
                    if (((float)pvVar15->m_index == (float)local_e8._0_4_) &&
                       (!NAN((float)pvVar15->m_index) && !NAN((float)local_e8._0_4_))) {
                      uVar19 = 0xffffffffffffffff;
                      do {
                        if (uVar19 == 4) goto LAB_00187d69;
                        puVar2 = &pvVar15[1].m_index + uVar19;
                        uVar24 = uVar19 + 1;
                        lVar14 = uVar19 - 4;
                      } while (((float)*puVar2 == local_d0[lVar14]) &&
                              (uVar19 = uVar24, !NAN((float)*puVar2) && !NAN(local_d0[lVar14])));
                      if (4 < uVar24) goto LAB_00187d69;
                    }
                    bVar10 = uVar22 == 0;
                    pvVar15 = pvVar15 + -4;
                    uVar22 = uVar22 - 1;
                    if (bVar10) {
                      pvVar15 = (value_type *)(prVar5 + uVar20);
                      uVar22 = uVar20;
                    }
                  } while (uVar27 != uVar22);
                }
                goto LAB_00187d23;
              }
LAB_00187cea:
              if ((this->m_node_index_map).m_grow_threshold <= (this->m_node_index_map).m_num_valid)
              {
                uVar11 = (this->m_node_index_map).m_values.m_size;
                goto LAB_00187d23;
              }
              pvVar15[2] = local_d8;
              pvVar15->m_index = local_e8._0_4_;
              pvVar15->m_variance = (float)local_e8._4_4_;
              pvVar15[1] = vStack_e0;
              pvVar15[3].m_index = (uint)local_d0[0];
              *(undefined1 *)&pvVar15[3].m_variance = 1;
              puVar2 = &(this->m_node_index_map).m_num_valid;
              *puVar2 = *puVar2 + 1;
            }
LAB_00187d69:
            uVar23 = uVar23 + 1;
          } while (uVar23 < pvVar13->m_end);
        }
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 < local_fc);
  }
  if (local_98.c.
      super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.c.
                    super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void generate_codebook(VectorType* vectors, uint* weights, uint size, uint max_splits, bool generate_node_index_map = false, task_pool* pTask_pool = 0) {
    m_vectors = vectors;
    m_vectorsInfo.resize(size);
    m_weightedVectors.resize(size);
    m_weightedDotProducts.resize(size);
    m_vectorsInfoLeft.resize(size);
    m_vectorsInfoRight.resize(size);
    m_vectorComparison.resize(size);
    m_nodes.resize(max_splits << 2);
    m_codebook.clear();
    uint num_tasks = pTask_pool ? pTask_pool->get_num_threads() + 1 : 1;

    vq_node root;
    root.m_begin = 0;
    root.m_end = size;
    double ttsum = 0.0f;
    for (uint i = 0; i < m_vectorsInfo.size(); i++) {
      const VectorType& v = vectors[i];
      m_vectorsInfo[i].index = i;
      const uint weight = m_vectorsInfo[i].weight = weights[i];
      m_weightedVectors[i] = v * (float)weight;
      root.m_centroid += m_weightedVectors[i];
      root.m_total_weight += weight;
      m_weightedDotProducts[i] = v.dot(v) * weight;
      ttsum += m_weightedDotProducts[i];
    }
    root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));
    root.m_centroid *= (1.0f / root.m_total_weight);

    std::priority_queue<NodeInfo> node_queue;
    uint begin_node = 0, end_node = begin_node, splits = 0;
    m_nodes[end_node] = root;
    node_queue.push(NodeInfo(end_node, root.m_variance));
    end_node++;
    splits++;

    if (num_tasks > 1) {
      while (splits < max_splits && node_queue.size() != num_tasks && split_node(node_queue, end_node, pTask_pool))
        splits++;
      if (node_queue.size() == num_tasks) {
        std::priority_queue<NodeInfo> alternative_node_queue = node_queue;
        uint alternative_node = max_splits << 1, alternative_max_splits = max_splits / num_tasks;
        crnlib::vector<split_alternative_node_task_params> params(num_tasks);
        for (uint task = 0; !alternative_node_queue.empty(); alternative_node_queue.pop(), alternative_node += alternative_max_splits << 1, task++) {
          params[task].main_node = alternative_node_queue.top().m_index;
          params[task].alternative_node = alternative_node;
          params[task].max_splits = alternative_max_splits;
          pTask_pool->queue_object_task(this, &tree_clusterizer::split_alternative_node_task, task, &params[task]);
        }
        pTask_pool->join();
      }
    }

    while (splits < max_splits && split_node(node_queue, end_node, pTask_pool))
      splits++;

    for (uint i = begin_node; i < end_node; i++) {
      vq_node& node = m_nodes[i];
      if (!node.m_alternative && node.m_left != -1)
        continue;
      node.m_codebook_index = m_codebook.size();
      m_codebook.push_back(node.m_centroid);
      if (generate_node_index_map) {
        for (uint j = node.m_begin; j < node.m_end; j++)
          m_node_index_map.insert(std::make_pair(m_vectors[m_vectorsInfo[j].index], node.m_codebook_index));
      }
    }
  }